

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

try_update_result_type __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_insert(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *this,art_key_type k,value_type v,olc_db_leaf_unique_ptr_type *cached_leaf)

{
  atomic<long> *paVar1;
  long lVar2;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  bVar3;
  optimistic_lock *poVar4;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *pbVar5;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_02;
  _Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  _Var6;
  undefined1 this_00 [8];
  bool bVar7;
  uint uVar8;
  int iVar9;
  uintptr_t result;
  pointer pbVar10;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var11;
  undefined8 uVar12;
  undefined8 __n;
  ushort uVar13;
  __atomic_base<unsigned_long> _Var14;
  __extent_storage<18446744073709551615UL> _Var15;
  node_type nVar16;
  pointer pbVar17;
  ushort uVar18;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  *this_01;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar19;
  undefined1 local_d0 [8];
  value_type v_local;
  art_key_type k_local;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  uint shared_prefix_length;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  art_key_type remaining_key;
  write_guard parent_guard;
  key_view existing_key;
  undefined1 local_58 [8];
  read_critical_section node_critical_section;
  undefined1 auStack_40 [4];
  tree_depth_type depth;
  read_critical_section parent_critical_section;
  
  pbVar17 = existing_key._M_ptr;
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  local_d0 = (undefined1  [8])v._M_ptr;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  v_local._M_extent._M_extent_value = k.field_0._0_8_;
  optimistic_lock::try_read_lock((optimistic_lock *)auStack_40);
  if (_auStack_40 == 0) {
    uVar18 = 0;
    uVar13 = 0;
  }
  else {
    _shared_prefix_length = (this->root).value._M_i.tagged_ptr;
    if ((EVP_PKEY_CTX *)_shared_prefix_length == (EVP_PKEY_CTX *)0x0) {
      k_02.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
      k_02.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
      v_02._M_extent._M_extent_value = (size_t)v_local._M_ptr;
      v_02._M_ptr = (pointer)local_d0;
      detail::
      create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                (cached_leaf,k_02,v_02,this);
      bVar7 = optimistic_lock::try_upgrade_to_write_lock
                        ((optimistic_lock *)_auStack_40,(version_type)parent_critical_section.lock);
      uVar13 = 0;
      node.tagged_ptr = 0;
      if (bVar7) {
        node.tagged_ptr = _auStack_40;
      }
      _auStack_40 = 0;
      if (node.tagged_ptr != 0) {
        pbVar5 = (cached_leaf->_M_t).
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                 ._M_head_impl;
        (cached_leaf->_M_t).
        super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
        ._M_head_impl =
             (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
              *)0x0;
        if (((ulong)pbVar5 & 7) != 0) {
LAB_00145262:
          __assert_fail("(result & ptr_bit_mask) == uintptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                        ,0x182,
                        "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                       );
        }
        (this->root).value._M_i.tagged_ptr = (uintptr_t)pbVar5;
        uVar13 = 0x100;
      }
      optimistic_lock::write_guard::~write_guard((write_guard *)&node);
LAB_001450fc:
      uVar18 = 1;
    }
    else {
      node_critical_section.version.version._4_4_ = 0;
      node.tagged_ptr = v_local._M_extent._M_extent_value;
      remaining_key.field_0.key._M_ptr = k_local.field_0.key._M_ptr;
      k_local.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)&this->root;
      bVar7 = optimistic_lock::check
                        ((optimistic_lock *)_auStack_40,(version_type)parent_critical_section.lock);
      if (bVar7) {
        optimistic_lock::try_read_lock((optimistic_lock *)local_58);
        if (local_58 != (undefined1  [8])0x0) {
LAB_00144b74:
          uVar12 = k_local.field_0.key._M_ptr;
          this_01 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                     *)(_shared_prefix_length & 0xfffffffffffffff8);
          nVar16 = (node_type)_shared_prefix_length;
          if ((_shared_prefix_length & 7) == 0) {
            parent_guard.lock = (optimistic_lock *)(this_01 + 0x20);
            pbVar17 = (pointer)(ulong)*(uint *)(this_01 + 0x18);
            k_00.field_0.key._M_extent._M_extent_value =
                 (__extent_storage<18446744073709551615UL>)
                 (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
            k_00.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
            __n = k_local.field_0.key._M_ptr;
            if (pbVar17 < k_local.field_0.key._M_ptr) {
              __n = pbVar17;
            }
            iVar9 = bcmp((void *)v_local._M_extent._M_extent_value,parent_guard.lock,__n);
            if ((pointer)uVar12 != pbVar17 || iVar9 != 0) {
              v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
              v_00._M_ptr = (pointer)local_d0;
              detail::
              create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                        (cached_leaf,k_00,v_00,this);
              detail::
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&node_in_parent,this,
                         (span<const_std::byte,_18446744073709551615UL> *)&parent_guard,
                         (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&node
                         ,(tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                           *)((long)&node_critical_section.version.version + 4));
              bVar7 = optimistic_lock::try_upgrade_to_write_lock
                                ((optimistic_lock *)_auStack_40,
                                 (version_type)parent_critical_section.lock);
              remaining_key.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)0;
              if (bVar7) {
                remaining_key.field_0.key._M_extent._M_extent_value =
                     (__extent_storage<18446744073709551615UL>)_auStack_40;
              }
              _auStack_40 = 0;
              if (remaining_key.field_0.key._M_extent._M_extent_value == 0) {
LAB_0014508b:
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&remaining_key.field_0.key._M_extent);
LAB_00145094:
                uVar13 = 0;
              }
              else {
                bVar7 = optimistic_lock::try_upgrade_to_write_lock
                                  ((optimistic_lock *)local_58,
                                   (version_type)node_critical_section.lock);
                _Var14._M_i = 0;
                if (bVar7) {
                  _Var14._M_i = (__int_type)local_58;
                }
                local_58 = (undefined1  [8])0x0;
                new_node._M_t.
                super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                ._M_head_impl =
                     (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)_Var14._M_i;
                if (_Var14._M_i == 0) {
                  optimistic_lock::write_guard::~write_guard
                            ((write_guard *)
                             &new_node._M_t.
                              super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                              .
                              super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                            );
                  goto LAB_0014508b;
                }
                detail::
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)new_node._M_t.
                          super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                          .
                          super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                          ._M_head_impl.db,(EVP_PKEY_CTX *)parent_guard.lock);
                _Var6 = new_node._M_t.
                        super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        .
                        super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ;
                new_node._M_t.
                super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                ._M_head_impl.db =
                     (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                      )(basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                        )0x0;
                if (((ulong)_Var6.
                            super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                            ._M_head_impl.db & 7) != 0) goto LAB_00145262;
                *(ulong *)k_local.field_0.key._M_extent._M_extent_value =
                     (ulong)_Var6.
                            super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                            ._M_head_impl.db | 1;
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)
                           &new_node._M_t.
                            super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            .
                            super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                          );
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&remaining_key.field_0.key._M_extent);
                if (_Var14._M_i == 0) goto LAB_00145094;
                LOCK();
                (this->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>._M_i =
                     (this->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>.
                     _M_i + 1;
                UNLOCK();
                uVar13 = 0x100;
              }
              if (new_node._M_t.
                  super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  .
                  super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  .
                  super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                  ._M_head_impl.db !=
                  (basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   )0x0) {
                free((void *)new_node._M_t.
                             super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                             ._M_head_impl.db);
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::
                decrement_inode_count<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                          ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                            *)node_in_parent);
              }
              uVar18 = 1;
              goto LAB_001450b8;
            }
            if ((((atomic<long> *)(_auStack_40 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_00145203:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar4 = *(optimistic_lock **)_auStack_40;
            if (parent_critical_section.lock != poVar4) {
              LOCK();
              paVar1 = (atomic<long> *)(_auStack_40 + 8);
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00145222;
              if (parent_critical_section.lock != poVar4) {
                _auStack_40 = 0;
                goto LAB_001452b3;
              }
            }
            LOCK();
            paVar1 = (atomic<long> *)(_auStack_40 + 8);
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00145222;
            _auStack_40 = 0;
            if (parent_critical_section.lock != poVar4) goto LAB_001452b3;
            if ((((atomic<long> *)((long)local_58 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_00145203;
            poVar4 = *(optimistic_lock **)local_58;
            if (node_critical_section.lock != poVar4) {
              LOCK();
              paVar1 = (atomic<long> *)((long)local_58 + 8);
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00145222;
              if (node_critical_section.lock != poVar4) {
                local_58 = (undefined1  [8])0x0;
                goto LAB_001452b3;
              }
            }
            LOCK();
            paVar1 = (atomic<long> *)((long)local_58 + 8);
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) == (paVar1->super___atomic_base<long>)._M_i < 0) {
              local_58 = (undefined1  [8])0x0;
              if (node_critical_section.lock == poVar4) {
                uVar13 = 0x100;
                if ((cached_leaf->_M_t).
                    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                    ._M_head_impl ==
                    (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                     *)0x0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = 0;
                  std::
                  __uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::reset((__uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)cached_leaf,(pointer)0x0);
                }
                goto LAB_001450b8;
              }
              goto LAB_001452b3;
            }
          }
          else {
            bVar3 = this_01[0x1f];
            if (7 < (byte)bVar3) {
              __assert_fail("result <= key_prefix_capacity",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                            ,0x298,
                            "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                           );
            }
            parent_guard.lock = (optimistic_lock *)0x0;
            uVar12 = remaining_key.field_0.key._M_ptr;
            if ((pointer)0x7 < remaining_key.field_0.key._M_ptr) {
              uVar12 = (pointer)0x8;
            }
            memcpy(&parent_guard,(void *)node.tagged_ptr,uVar12);
            uVar8 = detail::
                    key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                    ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                         *)(this_01 + 0x18),(uint64_t)parent_guard.lock);
            new_node._M_t.
            super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
            ._M_head_impl._0_4_ = uVar8;
            if (uVar8 < (byte)bVar3) {
              k_01.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)
                   (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
              k_01.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
              v_01._M_extent._M_extent_value = (size_t)v_local._M_ptr;
              v_01._M_ptr = (pointer)local_d0;
              detail::
              create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                        (cached_leaf,k_01,v_01,this);
              detail::
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>&,unsigned_int_const&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&parent_guard,this,
                         (basic_node_ptr<unodb::detail::olc_node_header> *)&shared_prefix_length,
                         (uint *)&new_node._M_t.
                                  super___uniq_ptr_impl<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  .
                                  super__Head_base<0UL,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                        );
              bVar7 = optimistic_lock::try_upgrade_to_write_lock
                                ((optimistic_lock *)_auStack_40,
                                 (version_type)parent_critical_section.lock);
              node_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)(optimistic_lock *)0x0;
              if (bVar7) {
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)_auStack_40;
              }
              _auStack_40 = 0;
              if ((optimistic_lock *)node_in_parent == (optimistic_lock *)0x0) {
LAB_001450ce:
                optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
LAB_001450da:
                uVar13 = 0;
              }
              else {
                bVar7 = optimistic_lock::try_upgrade_to_write_lock
                                  ((optimistic_lock *)local_58,
                                   (version_type)node_critical_section.lock);
                _Var15._M_extent_value = 0;
                if (bVar7) {
                  _Var15._M_extent_value = (size_t)local_58;
                }
                local_58 = (undefined1  [8])0x0;
                remaining_key.field_0.key._M_extent._M_extent_value =
                     (__extent_storage<18446744073709551615UL>)_Var15._M_extent_value;
                if (_Var15._M_extent_value == 0) {
                  optimistic_lock::write_guard::~write_guard
                            ((write_guard *)&remaining_key.field_0.key._M_extent);
                  goto LAB_001450ce;
                }
                detail::
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)existing_key._M_ptr,(EVP_PKEY_CTX *)_shared_prefix_length);
                existing_key._M_ptr = (pointer)0x0;
                if (((ulong)pbVar17 & 7) != 0) goto LAB_00145262;
                *(ulong *)k_local.field_0.key._M_extent._M_extent_value = (ulong)pbVar17 | 1;
                optimistic_lock::write_guard::~write_guard
                          ((write_guard *)&remaining_key.field_0.key._M_extent);
                optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
                if (_Var15._M_extent_value == 0) goto LAB_001450da;
                LOCK();
                (this->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>._M_i =
                     (this->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>.
                     _M_i + 1;
                UNLOCK();
                LOCK();
                (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i =
                     (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i + 1;
                UNLOCK();
                uVar13 = 0x100;
              }
              if (existing_key._M_ptr != (pointer)0x0) {
                free(existing_key._M_ptr);
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::
                decrement_inode_count<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                          ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                            *)parent_guard.lock);
              }
LAB_001450f3:
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)local_58);
              goto LAB_001450fc;
            }
            if (uVar8 != (byte)bVar3) {
              __assert_fail("shared_prefix_length == key_prefix_length",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x76f,
                            "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_insert(art_key_type, value_type, olc_db_leaf_unique_ptr_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                           );
            }
            node_critical_section.version.version._4_4_ =
                 node_critical_section.version.version._4_4_ + (uint)(byte)bVar3;
            pbVar10 = (pointer)(ulong)(uint)(byte)bVar3;
            if (remaining_key.field_0.key._M_ptr < pbVar10) goto LAB_00145241;
            parent_guard.lock._0_1_ = pbVar10[node.tagged_ptr];
            node.tagged_ptr = (uintptr_t)(pbVar10 + node.tagged_ptr);
            remaining_key.field_0.key._M_ptr = remaining_key.field_0.key._M_ptr + -(long)pbVar10;
            oVar19 = detail::
                     basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                     ::
                     add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                               (this_01,nVar16 & (I256|I48),(byte *)&parent_guard,
                                (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                 *)&v_local._M_extent,
                                (span<const_std::byte,_18446744073709551615UL> *)local_d0,this,
                                (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                                 *)((long)&node_critical_section.version.version + 4),
                                (read_critical_section *)local_58,
                                (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                 **)&k_local.field_0.key._M_extent,
                                (read_critical_section *)auStack_40,cached_leaf);
            this_00 = local_58;
            _Var11 = oVar19.
                     super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                     ._M_payload;
            if (((undefined1  [16])
                 oVar19.
                 super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00144d38:
              uVar13 = 0;
              goto LAB_001450f3;
            }
            if (_Var11._M_value ==
                (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 *)0x0) {
              uVar13 = 0x100;
              goto LAB_001450f3;
            }
            if ((((atomic<long> *)(_auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_00145203;
            poVar4 = *(optimistic_lock **)_auStack_40;
            if (parent_critical_section.lock != poVar4) {
              LOCK();
              paVar1 = (atomic<long> *)(_auStack_40 + 8);
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00145222;
              if (parent_critical_section.lock != poVar4) {
                _auStack_40 = 0;
                goto LAB_00144d38;
              }
            }
            LOCK();
            paVar1 = (atomic<long> *)(_auStack_40 + 8);
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) == (paVar1->super___atomic_base<long>)._M_i < 0) {
              _auStack_40 = 0;
              if (parent_critical_section.lock != poVar4) goto LAB_00144d38;
              _shared_prefix_length = ((_Var11._M_value)->value)._M_i.tagged_ptr;
              _auStack_40 = (__int_type)local_58;
              local_58 = (undefined1  [8])0x0;
              parent_critical_section.lock = node_critical_section.lock;
              node_critical_section.version.version._4_4_ =
                   node_critical_section.version.version._4_4_ + 1;
              k_local.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)_Var11;
              if (remaining_key.field_0.key._M_ptr == (pointer)0x0) {
LAB_00145241:
                __assert_fail("num_bytes <= key.size_bytes()",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                              ,0xc0,
                              "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                             );
              }
              remaining_key.field_0.key._M_ptr = remaining_key.field_0.key._M_ptr + -1;
              node.tagged_ptr = node.tagged_ptr + 1;
              bVar7 = optimistic_lock::check
                                ((optimistic_lock *)this_00,(version_type)node_critical_section.lock
                                );
              if (!bVar7) {
                _auStack_40 = 0;
                optimistic_lock::read_critical_section::~read_critical_section
                          ((read_critical_section *)local_58);
                goto LAB_00144fda;
              }
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)local_58);
              optimistic_lock::try_read_lock((optimistic_lock *)local_58);
              if (local_58 == (undefined1  [8])0x0) goto LAB_001452b3;
              goto LAB_00144b74;
            }
          }
LAB_00145222:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
LAB_001452b3:
        uVar18 = 0;
        uVar13 = 0;
LAB_001450b8:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)local_58);
      }
      else {
        _auStack_40 = 0;
LAB_00144fda:
        uVar18 = 0;
        uVar13 = 0;
      }
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)auStack_40);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar13 | uVar18);
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_insert(art_key_type k, value_type v,
                               olc_db_leaf_unique_ptr_type& cached_leaf) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    create_leaf_if_needed(cached_leaf, k, v, *this);

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) {
      // Do not call spin_wait_loop_body here - creating the leaf took some time
      return {};  // LCOV_EXCL_LINE
    }

    root = detail::olc_node_ptr{cached_leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  while (true) {
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      if (UNODB_DETAIL_UNLIKELY(k.cmp(existing_key) == 0)) {
        if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE

        if (UNODB_DETAIL_UNLIKELY(cached_leaf != nullptr)) {
          cached_leaf.reset();  // LCOV_EXCL_LINE
        }
        return false;  // exists
      }

      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(existing_key, remaining_key, depth, leaf,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, node, shared_prefix_length)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(node, shared_prefix_length, depth,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }

#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      key_prefix_splits.fetch_add(1, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS

      return true;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);

    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto add_result{inode->template add_or_choose_subtree<
        std::optional<in_critical_section<detail::olc_node_ptr>*>>(
        node_type, remaining_key[0], k, v, *this, depth, node_critical_section,
        node_in_parent, parent_critical_section, cached_leaf)};

    if (UNODB_DETAIL_UNLIKELY(!add_result)) return {};

    auto* const child_in_parent = *add_result;
    if (child_in_parent == nullptr) return true;

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    ++depth;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}